

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O1

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>::~Holder
          (Holder<(anonymous_namespace)::Q_QGS_knownPointers> *this)

{
  QHash<const_volatile_void_*,_const_void_*>::~QHash
            ((QHash<const_volatile_void_*,_const_void_*> *)(this + 0x10));
  QHash<const_void_*,_(anonymous_namespace)::Data>::~QHash
            ((QHash<const_void_*,_(anonymous_namespace)::Data> *)(this + 8));
  QMutex::~QMutex((QMutex *)this);
  guard._q_value.super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xfe;
  return;
}

Assistant:

~Holder()
    {
        // TSAN does not support atomic_thread_fence and GCC complains:
        // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=97868
        // https://github.com/google/sanitizers/issues/1352
        // QTBUG-134415
QT_WARNING_PUSH
#if defined(Q_CC_GNU_ONLY) && Q_CC_GNU >= 1100
QT_WARNING_DISABLE_GCC("-Wtsan")
#endif
        // import changes to *pointer() by other threads before running ~PlainType():
        std::atomic_thread_fence(std::memory_order_acquire);
QT_WARNING_POP
        pointer()->~PlainType();
        guard.storeRelease(QtGlobalStatic::Destroyed);
    }